

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plf_stack.h
# Opt level: O3

void __thiscall
plf::stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_>::initialize
          (stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_> *this)

{
  size_type __n;
  element_pointer_type pMVar1;
  group_pointer_type this_00;
  MatchingStateDebugFailures *pMVar2;
  
  this_00 = (group_pointer_type)operator_new(0x20);
  this->current_group = this_00;
  this->first_group = this_00;
  __n = this->min_block_capacity;
  pMVar2 = __gnu_cxx::new_allocator<MatchingStateDebugFailures>::allocate
                     ((new_allocator<MatchingStateDebugFailures> *)this_00,__n,(void *)0x0);
  this_00->elements = pMVar2;
  this_00->next_group = (group_pointer_type)0x0;
  this_00->previous_group = (group_pointer_type)0x0;
  this_00->end = pMVar2 + (__n - 1);
  pMVar1 = this->first_group->elements;
  this->start_element = pMVar1;
  this->top_element = pMVar1;
  this->end_element = this->first_group->end;
  return;
}

Assistant:

void initialize()
	{
		first_group = current_group = PLF_ALLOCATE(group_allocator_type, group_allocator_pair, 1, 0);

		// Initialize:
		try
		{
			#ifdef PLF_VARIADICS_SUPPORT
				PLF_CONSTRUCT(group_allocator_type, group_allocator_pair, first_group, min_block_capacity);
			#else
				PLF_CONSTRUCT(group_allocator_type, group_allocator_pair, first_group, group(min_block_capacity));
			#endif
		}
		catch (...)
		{
			PLF_DEALLOCATE(group_allocator_type, group_allocator_pair, first_group, 1);
			first_group = current_group = NULL;
			throw;
		}

		top_element = start_element = first_group->elements;
		end_element = first_group->end;
	}